

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O3

void fadst8_avx2(__m256i *in,__m256i *out,int8_t bit,int col_num,int outstirde)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  long lVar29;
  long lVar30;
  int iVar31;
  undefined7 in_register_00000011;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  uint local_1f8;
  
  iVar31 = 1 << (bit - 1U & 0x1f);
  if (0 < col_num) {
    local_1f8 = (uint)CONCAT71(in_register_00000011,bit);
    lVar29 = (long)(int)local_1f8;
    lVar30 = lVar29 * 0x100;
    uVar1 = *(undefined4 *)(&DAT_004dedc0 + lVar30);
    auVar36._4_4_ = uVar1;
    auVar36._0_4_ = uVar1;
    auVar36._8_4_ = uVar1;
    auVar36._12_4_ = uVar1;
    auVar36._16_4_ = uVar1;
    auVar36._20_4_ = uVar1;
    auVar36._24_4_ = uVar1;
    auVar36._28_4_ = uVar1;
    iVar9 = *(int *)(&DAT_004ded50 + lVar29 * 0x20);
    iVar10 = *(int *)(&DAT_004ded80 + lVar30);
    iVar35 = -iVar10;
    uVar1 = *(undefined4 *)(&DAT_004dee00 + lVar30);
    auVar38._4_4_ = uVar1;
    auVar38._0_4_ = uVar1;
    auVar38._8_4_ = uVar1;
    auVar38._12_4_ = uVar1;
    auVar38._16_4_ = uVar1;
    auVar38._20_4_ = uVar1;
    auVar38._24_4_ = uVar1;
    auVar38._28_4_ = uVar1;
    iVar32 = -iVar9;
    uVar1 = *(undefined4 *)(&DAT_004dee30 + lVar30);
    iVar11 = *(int *)(&DAT_004ded90 + lVar30);
    iVar33 = -iVar11;
    uVar2 = *(undefined4 *)(&DAT_004dedf0 + lVar30);
    uVar3 = *(undefined4 *)(&DAT_004dedb0 + lVar30);
    iVar12 = *(int *)(&DAT_004dedd0 + lVar30);
    iVar34 = -iVar12;
    uVar4 = *(undefined4 *)(&DAT_004dee10 + lVar30);
    uVar5 = *(undefined4 *)(&DAT_004ded70 + lVar29 * 0x20);
    auVar39._4_4_ = iVar31;
    auVar39._0_4_ = iVar31;
    auVar39._8_4_ = iVar31;
    auVar39._12_4_ = iVar31;
    auVar39._16_4_ = iVar31;
    auVar39._20_4_ = iVar31;
    auVar39._24_4_ = iVar31;
    auVar39._28_4_ = iVar31;
    lVar29 = 0;
    do {
      auVar6 = *(undefined1 (*) [32])((long)*in + lVar29);
      auVar7 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 7)] + lVar29);
      auVar13 = vpmulld_avx2(auVar36,*(undefined1 (*) [32])((long)in[(uint)(col_num * 3)] + lVar29))
      ;
      auVar14 = vpmulld_avx2(auVar36,*(undefined1 (*) [32])((long)in[(uint)(col_num * 4)] + lVar29))
      ;
      auVar8 = *(undefined1 (*) [32])((long)in[(uint)col_num] + lVar29);
      auVar17 = vpsubd_avx2(auVar39,auVar13);
      auVar17 = vpaddd_avx2(auVar14,auVar17);
      auVar15 = vpsrad_avx2(auVar17,ZEXT416(local_1f8));
      auVar17 = vpaddd_avx2(auVar14,auVar13);
      auVar17 = vpsubd_avx2(auVar39,auVar17);
      auVar16 = vpsrad_avx2(auVar17,ZEXT416(local_1f8));
      auVar13 = vpmulld_avx2(auVar36,*(undefined1 (*) [32])((long)in[(uint)(col_num * 2)] + lVar29))
      ;
      auVar17 = *(undefined1 (*) [32])((long)in[(uint)(col_num * 6)] + lVar29);
      auVar14 = vpmulld_avx2(auVar36,*(undefined1 (*) [32])((long)in[(uint)(col_num * 5)] + lVar29))
      ;
      auVar13 = vpaddd_avx2(auVar39,auVar13);
      auVar18 = vpsubd_avx2(auVar13,auVar14);
      auVar37 = ZEXT416(local_1f8);
      auVar18 = vpsrad_avx2(auVar18,auVar37);
      auVar13 = vpaddd_avx2(auVar14,auVar13);
      auVar14 = vpsrad_avx2(auVar13,auVar37);
      auVar13 = vpaddd_avx2(auVar15,auVar6);
      auVar19 = vpsubd_avx2(auVar16,auVar7);
      auVar20 = vpsubd_avx2(auVar6,auVar15);
      auVar6 = vpaddd_avx2(auVar16,auVar7);
      auVar16 = vpsubd_avx2(auVar18,auVar8);
      auVar7 = vpaddd_avx2(auVar14,auVar17);
      auVar8 = vpaddd_avx2(auVar18,auVar8);
      auVar18 = vpsubd_avx2(auVar17,auVar14);
      auVar21._4_4_ = iVar10;
      auVar21._0_4_ = iVar10;
      auVar21._8_4_ = iVar10;
      auVar21._12_4_ = iVar10;
      auVar21._16_4_ = iVar10;
      auVar21._20_4_ = iVar10;
      auVar21._24_4_ = iVar10;
      auVar21._28_4_ = iVar10;
      auVar17 = vpmulld_avx2(auVar16,auVar21);
      auVar14 = vpmulld_avx2(auVar7,auVar38);
      auVar17 = vpaddd_avx2(auVar17,auVar39);
      auVar17 = vpaddd_avx2(auVar17,auVar14);
      auVar15 = vpsrad_avx2(auVar17,auVar37);
      auVar17 = vpmulld_avx2(auVar16,auVar38);
      auVar28._4_4_ = iVar35;
      auVar28._0_4_ = iVar35;
      auVar28._8_4_ = iVar35;
      auVar28._12_4_ = iVar35;
      auVar28._16_4_ = iVar35;
      auVar28._20_4_ = iVar35;
      auVar28._24_4_ = iVar35;
      auVar28._28_4_ = iVar35;
      auVar14 = vpmulld_avx2(auVar7,auVar28);
      auVar7 = vpaddd_avx2(auVar17,auVar39);
      auVar7 = vpaddd_avx2(auVar7,auVar14);
      auVar14 = vpsrad_avx2(auVar7,auVar37);
      auVar7 = vpmulld_avx2(auVar8,auVar38);
      auVar17 = vpmulld_avx2(auVar18,auVar21);
      auVar7 = vpaddd_avx2(auVar7,auVar39);
      auVar7 = vpaddd_avx2(auVar7,auVar17);
      auVar37 = ZEXT416(local_1f8);
      auVar16 = vpsrad_avx2(auVar7,auVar37);
      auVar7 = vpmulld_avx2(auVar18,auVar38);
      auVar8 = vpmulld_avx2(auVar21,auVar8);
      auVar8 = vpsubd_avx2(auVar39,auVar8);
      auVar7 = vpaddd_avx2(auVar8,auVar7);
      auVar18 = vpsrad_avx2(auVar7,auVar37);
      auVar7 = vpaddd_avx2(auVar15,auVar13);
      auVar8 = vpaddd_avx2(auVar14,auVar19);
      auVar21 = vpsubd_avx2(auVar13,auVar15);
      auVar17 = vpaddd_avx2(auVar16,auVar20);
      auVar19 = vpsubd_avx2(auVar19,auVar14);
      auVar15 = vpsubd_avx2(auVar18,auVar6);
      auVar20 = vpsubd_avx2(auVar20,auVar16);
      auVar6 = vpaddd_avx2(auVar18,auVar6);
      auVar13._4_4_ = iVar9;
      auVar13._0_4_ = iVar9;
      auVar13._8_4_ = iVar9;
      auVar13._12_4_ = iVar9;
      auVar13._16_4_ = iVar9;
      auVar13._20_4_ = iVar9;
      auVar13._24_4_ = iVar9;
      auVar13._28_4_ = iVar9;
      auVar13 = vpmulld_avx2(auVar7,auVar13);
      auVar26._4_4_ = uVar1;
      auVar26._0_4_ = uVar1;
      auVar26._8_4_ = uVar1;
      auVar26._12_4_ = uVar1;
      auVar26._16_4_ = uVar1;
      auVar26._20_4_ = uVar1;
      auVar26._24_4_ = uVar1;
      auVar26._28_4_ = uVar1;
      auVar14 = vpmulld_avx2(auVar8,auVar26);
      auVar13 = vpaddd_avx2(auVar39,auVar13);
      auVar13 = vpaddd_avx2(auVar13,auVar14);
      auVar7 = vpmulld_avx2(auVar7,auVar26);
      auVar27._4_4_ = iVar32;
      auVar27._0_4_ = iVar32;
      auVar27._8_4_ = iVar32;
      auVar27._12_4_ = iVar32;
      auVar27._16_4_ = iVar32;
      auVar27._20_4_ = iVar32;
      auVar27._24_4_ = iVar32;
      auVar27._28_4_ = iVar32;
      auVar8 = vpmulld_avx2(auVar8,auVar27);
      auVar7 = vpaddd_avx2(auVar39,auVar7);
      auVar7 = vpaddd_avx2(auVar8,auVar7);
      auVar8._4_4_ = iVar11;
      auVar8._0_4_ = iVar11;
      auVar8._8_4_ = iVar11;
      auVar8._12_4_ = iVar11;
      auVar8._16_4_ = iVar11;
      auVar8._20_4_ = iVar11;
      auVar8._24_4_ = iVar11;
      auVar8._28_4_ = iVar11;
      auVar8 = vpmulld_avx2(auVar17,auVar8);
      auVar25._4_4_ = uVar2;
      auVar25._0_4_ = uVar2;
      auVar25._8_4_ = uVar2;
      auVar25._12_4_ = uVar2;
      auVar25._16_4_ = uVar2;
      auVar25._20_4_ = uVar2;
      auVar25._24_4_ = uVar2;
      auVar25._28_4_ = uVar2;
      auVar14 = vpmulld_avx2(auVar15,auVar25);
      auVar8 = vpaddd_avx2(auVar8,auVar39);
      auVar8 = vpaddd_avx2(auVar8,auVar14);
      auVar17 = vpmulld_avx2(auVar17,auVar25);
      auVar18._4_4_ = iVar33;
      auVar18._0_4_ = iVar33;
      auVar18._8_4_ = iVar33;
      auVar18._12_4_ = iVar33;
      auVar18._16_4_ = iVar33;
      auVar18._20_4_ = iVar33;
      auVar18._24_4_ = iVar33;
      auVar18._28_4_ = iVar33;
      auVar14 = vpmulld_avx2(auVar15,auVar18);
      auVar17 = vpaddd_avx2(auVar17,auVar39);
      auVar17 = vpaddd_avx2(auVar17,auVar14);
      auVar14._4_4_ = iVar12;
      auVar14._0_4_ = iVar12;
      auVar14._8_4_ = iVar12;
      auVar14._12_4_ = iVar12;
      auVar14._16_4_ = iVar12;
      auVar14._20_4_ = iVar12;
      auVar14._24_4_ = iVar12;
      auVar14._28_4_ = iVar12;
      auVar14 = vpmulld_avx2(auVar21,auVar14);
      auVar24._4_4_ = uVar3;
      auVar24._0_4_ = uVar3;
      auVar24._8_4_ = uVar3;
      auVar24._12_4_ = uVar3;
      auVar24._16_4_ = uVar3;
      auVar24._20_4_ = uVar3;
      auVar24._24_4_ = uVar3;
      auVar24._28_4_ = uVar3;
      auVar15 = vpmulld_avx2(auVar19,auVar24);
      auVar14 = vpaddd_avx2(auVar14,auVar39);
      auVar14 = vpaddd_avx2(auVar14,auVar15);
      auVar15 = vpmulld_avx2(auVar21,auVar24);
      auVar16._4_4_ = iVar34;
      auVar16._0_4_ = iVar34;
      auVar16._8_4_ = iVar34;
      auVar16._12_4_ = iVar34;
      auVar16._16_4_ = iVar34;
      auVar16._20_4_ = iVar34;
      auVar16._24_4_ = iVar34;
      auVar16._28_4_ = iVar34;
      auVar16 = vpmulld_avx2(auVar19,auVar16);
      auVar15 = vpaddd_avx2(auVar15,auVar39);
      auVar15 = vpaddd_avx2(auVar15,auVar16);
      auVar23._4_4_ = uVar4;
      auVar23._0_4_ = uVar4;
      auVar23._8_4_ = uVar4;
      auVar23._12_4_ = uVar4;
      auVar23._16_4_ = uVar4;
      auVar23._20_4_ = uVar4;
      auVar23._24_4_ = uVar4;
      auVar23._28_4_ = uVar4;
      auVar16 = vpmulld_avx2(auVar20,auVar23);
      auVar22._4_4_ = uVar5;
      auVar22._0_4_ = uVar5;
      auVar22._8_4_ = uVar5;
      auVar22._12_4_ = uVar5;
      auVar22._16_4_ = uVar5;
      auVar22._20_4_ = uVar5;
      auVar22._24_4_ = uVar5;
      auVar22._28_4_ = uVar5;
      auVar18 = vpmulld_avx2(auVar22,auVar6);
      auVar16 = vpaddd_avx2(auVar16,auVar39);
      auVar19 = vpsubd_avx2(auVar16,auVar18);
      auVar16 = vpmulld_avx2(auVar20,auVar22);
      auVar18 = vpmulld_avx2(auVar6,auVar23);
      auVar6 = vpaddd_avx2(auVar39,auVar16);
      auVar6 = vpaddd_avx2(auVar6,auVar18);
      auVar13 = vpsrad_avx2(auVar13,auVar37);
      auVar7 = vpsrad_avx2(auVar7,auVar37);
      auVar8 = vpsrad_avx2(auVar8,auVar37);
      auVar17 = vpsrad_avx2(auVar17,auVar37);
      auVar14 = vpsrad_avx2(auVar14,auVar37);
      auVar15 = vpsrad_avx2(auVar15,auVar37);
      auVar16 = vpsrad_avx2(auVar19,ZEXT416(local_1f8));
      auVar6 = vpsrad_avx2(auVar6,ZEXT416(local_1f8));
      *(undefined1 (*) [32])((long)*out + lVar29) = auVar7;
      *(undefined1 (*) [32])((long)out[outstirde] + lVar29) = auVar16;
      *(undefined1 (*) [32])((long)out[outstirde * 2] + lVar29) = auVar17;
      *(undefined1 (*) [32])((long)out[outstirde * 3] + lVar29) = auVar14;
      *(undefined1 (*) [32])((long)out[outstirde * 4] + lVar29) = auVar15;
      *(undefined1 (*) [32])((long)out[outstirde * 5] + lVar29) = auVar8;
      *(undefined1 (*) [32])((long)out[outstirde * 6] + lVar29) = auVar6;
      *(undefined1 (*) [32])((long)out[outstirde * 7] + lVar29) = auVar13;
      lVar29 = lVar29 + 0x20;
    } while ((ulong)(uint)col_num * 0x20 != lVar29);
  }
  return;
}

Assistant:

static void fadst8_avx2(__m256i *in, __m256i *out, const int8_t bit,
                        const int col_num, const int outstirde) {
  (void)col_num;
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospim4 = _mm256_set1_epi32(-cospi[4]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi20 = _mm256_set1_epi32(cospi[20]);
  const __m256i cospim20 = _mm256_set1_epi32(-cospi[20]);
  const __m256i cospi44 = _mm256_set1_epi32(cospi[44]);
  const __m256i cospi28 = _mm256_set1_epi32(cospi[28]);
  const __m256i cospi36 = _mm256_set1_epi32(cospi[36]);
  const __m256i cospim36 = _mm256_set1_epi32(-cospi[36]);
  const __m256i cospi52 = _mm256_set1_epi32(cospi[52]);
  const __m256i cospim52 = _mm256_set1_epi32(-cospi[52]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const __m256i zero = _mm256_setzero_si256();
  __m256i u0, u1, u2, u3, u4, u5, u6, u7;
  __m256i v0, v1, v2, v3, v4, v5, v6, v7;
  __m256i x, y;
  for (int col = 0; col < col_num; ++col) {
    u0 = in[0 * col_num + col];
    u1 = _mm256_sub_epi32(zero, in[7 * col_num + col]);
    u2 = _mm256_sub_epi32(zero, in[3 * col_num + col]);
    u3 = in[4 * col_num + col];
    u4 = _mm256_sub_epi32(zero, in[1 * col_num + col]);
    u5 = in[6 * col_num + col];
    u6 = in[2 * col_num + col];
    u7 = _mm256_sub_epi32(zero, in[5 * col_num + col]);

    // stage 2
    v0 = u0;
    v1 = u1;

    x = _mm256_mullo_epi32(u2, cospi32);
    y = _mm256_mullo_epi32(u3, cospi32);
    v2 = _mm256_add_epi32(x, y);
    v2 = _mm256_add_epi32(v2, rnding);
    v2 = _mm256_srai_epi32(v2, bit);

    v3 = _mm256_sub_epi32(x, y);
    v3 = _mm256_add_epi32(v3, rnding);
    v3 = _mm256_srai_epi32(v3, bit);

    v4 = u4;
    v5 = u5;

    x = _mm256_mullo_epi32(u6, cospi32);
    y = _mm256_mullo_epi32(u7, cospi32);
    v6 = _mm256_add_epi32(x, y);
    v6 = _mm256_add_epi32(v6, rnding);
    v6 = _mm256_srai_epi32(v6, bit);

    v7 = _mm256_sub_epi32(x, y);
    v7 = _mm256_add_epi32(v7, rnding);
    v7 = _mm256_srai_epi32(v7, bit);

    // stage 3
    u0 = _mm256_add_epi32(v0, v2);
    u1 = _mm256_add_epi32(v1, v3);
    u2 = _mm256_sub_epi32(v0, v2);
    u3 = _mm256_sub_epi32(v1, v3);
    u4 = _mm256_add_epi32(v4, v6);
    u5 = _mm256_add_epi32(v5, v7);
    u6 = _mm256_sub_epi32(v4, v6);
    u7 = _mm256_sub_epi32(v5, v7);

    // stage 4
    v0 = u0;
    v1 = u1;
    v2 = u2;
    v3 = u3;

    x = _mm256_mullo_epi32(u4, cospi16);
    y = _mm256_mullo_epi32(u5, cospi48);
    v4 = _mm256_add_epi32(x, y);
    v4 = _mm256_add_epi32(v4, rnding);
    v4 = _mm256_srai_epi32(v4, bit);

    x = _mm256_mullo_epi32(u4, cospi48);
    y = _mm256_mullo_epi32(u5, cospim16);
    v5 = _mm256_add_epi32(x, y);
    v5 = _mm256_add_epi32(v5, rnding);
    v5 = _mm256_srai_epi32(v5, bit);

    x = _mm256_mullo_epi32(u6, cospim48);
    y = _mm256_mullo_epi32(u7, cospi16);
    v6 = _mm256_add_epi32(x, y);
    v6 = _mm256_add_epi32(v6, rnding);
    v6 = _mm256_srai_epi32(v6, bit);

    x = _mm256_mullo_epi32(u6, cospi16);
    y = _mm256_mullo_epi32(u7, cospi48);
    v7 = _mm256_add_epi32(x, y);
    v7 = _mm256_add_epi32(v7, rnding);
    v7 = _mm256_srai_epi32(v7, bit);

    // stage 5
    u0 = _mm256_add_epi32(v0, v4);
    u1 = _mm256_add_epi32(v1, v5);
    u2 = _mm256_add_epi32(v2, v6);
    u3 = _mm256_add_epi32(v3, v7);
    u4 = _mm256_sub_epi32(v0, v4);
    u5 = _mm256_sub_epi32(v1, v5);
    u6 = _mm256_sub_epi32(v2, v6);
    u7 = _mm256_sub_epi32(v3, v7);

    // stage 6
    x = _mm256_mullo_epi32(u0, cospi4);
    y = _mm256_mullo_epi32(u1, cospi60);
    v0 = _mm256_add_epi32(x, y);
    v0 = _mm256_add_epi32(v0, rnding);
    v0 = _mm256_srai_epi32(v0, bit);

    x = _mm256_mullo_epi32(u0, cospi60);
    y = _mm256_mullo_epi32(u1, cospim4);
    v1 = _mm256_add_epi32(x, y);
    v1 = _mm256_add_epi32(v1, rnding);
    v1 = _mm256_srai_epi32(v1, bit);

    x = _mm256_mullo_epi32(u2, cospi20);
    y = _mm256_mullo_epi32(u3, cospi44);
    v2 = _mm256_add_epi32(x, y);
    v2 = _mm256_add_epi32(v2, rnding);
    v2 = _mm256_srai_epi32(v2, bit);

    x = _mm256_mullo_epi32(u2, cospi44);
    y = _mm256_mullo_epi32(u3, cospim20);
    v3 = _mm256_add_epi32(x, y);
    v3 = _mm256_add_epi32(v3, rnding);
    v3 = _mm256_srai_epi32(v3, bit);

    x = _mm256_mullo_epi32(u4, cospi36);
    y = _mm256_mullo_epi32(u5, cospi28);
    v4 = _mm256_add_epi32(x, y);
    v4 = _mm256_add_epi32(v4, rnding);
    v4 = _mm256_srai_epi32(v4, bit);

    x = _mm256_mullo_epi32(u4, cospi28);
    y = _mm256_mullo_epi32(u5, cospim36);
    v5 = _mm256_add_epi32(x, y);
    v5 = _mm256_add_epi32(v5, rnding);
    v5 = _mm256_srai_epi32(v5, bit);

    x = _mm256_mullo_epi32(u6, cospi52);
    y = _mm256_mullo_epi32(u7, cospi12);
    v6 = _mm256_add_epi32(x, y);
    v6 = _mm256_add_epi32(v6, rnding);
    v6 = _mm256_srai_epi32(v6, bit);

    x = _mm256_mullo_epi32(u6, cospi12);
    y = _mm256_mullo_epi32(u7, cospim52);
    v7 = _mm256_add_epi32(x, y);
    v7 = _mm256_add_epi32(v7, rnding);
    v7 = _mm256_srai_epi32(v7, bit);

    // stage 7
    out[0 * outstirde + col] = v1;
    out[1 * outstirde + col] = v6;
    out[2 * outstirde + col] = v3;
    out[3 * outstirde + col] = v4;
    out[4 * outstirde + col] = v5;
    out[5 * outstirde + col] = v2;
    out[6 * outstirde + col] = v7;
    out[7 * outstirde + col] = v0;
  }
}